

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O0

bool __thiscall
chatra::Thread::checkDebugBreak<chatra::Thread::stepRun()::__3>
          (Thread *this,Node *node0,Thread *thread,ulong *phase)

{
  bool bVar1;
  size_t *phase_local;
  Thread *thread_local;
  Node *node0_local;
  Thread *this_local;
  
  bVar1 = stepRun::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)((long)&this_local + 6),*phase & 0x7fffffffffffffff)
  ;
  if (bVar1) {
    if ((*phase & 0x8000000000000000) == 0) {
      *phase = *phase | 0x8000000000000000;
      RuntimeImp::debugBreak(this->runtime,node0,thread);
      this_local._7_1_ = true;
    }
    else {
      *phase = *phase & 0x7fffffffffffffff;
      this_local._7_1_ = false;
    }
  }
  else {
    *phase = *phase & 0x7fffffffffffffff;
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Thread::checkDebugBreak(Node* node0, Thread* thread, size_t& phase, PhaseCond phaseCond) {
	if (!phaseCond(phase & Phase::PhaseMask)) {
		phase &= Phase::PhaseMask;
		return false;
	}

	if ((phase & Phase::BreakPointFlag) == 0) {
		phase |= Phase::BreakPointFlag;
		runtime.debugBreak(node0, thread);
		return true;
	}

	phase &= Phase::PhaseMask;
	return false;
}